

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u8 * pageFindSlot(MemPage *pPg,int nByte,int *pRc)

{
  u32 uVar1;
  u8 *puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int size;
  int usableSize;
  int x;
  int pc;
  int iAddr;
  u8 *aData;
  int hdr;
  int *pRc_local;
  int nByte_local;
  MemPage *pPg_local;
  
  uVar3 = (uint)pPg->hdrOffset;
  puVar2 = pPg->aData;
  x = uVar3 + 1;
  uVar1 = pPg->pBt->usableSize;
  usableSize = (uint)CONCAT11(puVar2[x],puVar2[(long)x + 1]);
  do {
    if ((int)(uVar1 - 4) < usableSize) break;
    uVar4 = (uint)CONCAT11(puVar2[usableSize + 2],puVar2[(long)(usableSize + 2) + 1]);
    iVar5 = uVar4 - nByte;
    if (-1 < iVar5) {
      if ((int)uVar1 < (int)(uVar4 + usableSize)) {
        iVar5 = sqlite3CorruptError(0xfbdc);
        *pRc = iVar5;
        return (u8 *)0x0;
      }
      if (iVar5 < 4) {
        if (0x39 < puVar2[(int)(uVar3 + 7)]) {
          return (u8 *)0x0;
        }
        *(undefined2 *)(puVar2 + x) = *(undefined2 *)(puVar2 + usableSize);
        puVar2[(int)(uVar3 + 7)] = puVar2[(int)(uVar3 + 7)] + (u8)iVar5;
      }
      else {
        puVar2[usableSize + 2] = (u8)((uint)iVar5 >> 8);
        puVar2[(long)(usableSize + 2) + 1] = (u8)iVar5;
      }
      return puVar2 + (usableSize + iVar5);
    }
    x = usableSize;
    uVar6 = (uint)CONCAT11(puVar2[usableSize],puVar2[(long)usableSize + 1]);
    uVar4 = usableSize + uVar4;
    usableSize = uVar6;
  } while (uVar4 <= uVar6);
  if (usableSize != 0) {
    iVar5 = sqlite3CorruptError(0xfbf3);
    *pRc = iVar5;
  }
  return (u8 *)0x0;
}

Assistant:

static u8 *pageFindSlot(MemPage *pPg, int nByte, int *pRc){
  const int hdr = pPg->hdrOffset;
  u8 * const aData = pPg->aData;
  int iAddr = hdr + 1;
  int pc = get2byte(&aData[iAddr]);
  int x;
  int usableSize = pPg->pBt->usableSize;
  int size;            /* Size of the free slot */

  assert( pc>0 );
  while( pc<=usableSize-4 ){
    /* EVIDENCE-OF: R-22710-53328 The third and fourth bytes of each
    ** freeblock form a big-endian integer which is the size of the freeblock
    ** in bytes, including the 4-byte header. */
    size = get2byte(&aData[pc+2]);
    if( (x = size - nByte)>=0 ){
      testcase( x==4 );
      testcase( x==3 );
      if( size+pc > usableSize ){
        *pRc = SQLITE_CORRUPT_PAGE(pPg);
        return 0;
      }else if( x<4 ){
        /* EVIDENCE-OF: R-11498-58022 In a well-formed b-tree page, the total
        ** number of bytes in fragments may not exceed 60. */
        if( aData[hdr+7]>57 ) return 0;

        /* Remove the slot from the free-list. Update the number of
        ** fragmented bytes within the page. */
        memcpy(&aData[iAddr], &aData[pc], 2);
        aData[hdr+7] += (u8)x;
      }else{
        /* The slot remains on the free-list. Reduce its size to account
         ** for the portion used by the new allocation. */
        put2byte(&aData[pc+2], x);
      }
      return &aData[pc + x];
    }
    iAddr = pc;
    pc = get2byte(&aData[pc]);
    if( pc<iAddr+size ) break;
  }
  if( pc ){
    *pRc = SQLITE_CORRUPT_PAGE(pPg);
  }

  return 0;
}